

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O0

void count_components(void)

{
  bool bVar1;
  reference local_20;
  int local_10;
  int local_c;
  int i;
  int comp_num;
  
  freopen("components.txt","w",_stdout);
  local_c = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,(long)V,false);
  for (local_10 = 0; local_10 < V; local_10 = local_10 + 1) {
    local_20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::useddfs,
                          (long)local_10);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_20);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::vector<int,_std::allocator<int>_>::clear
                ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::comp);
      dfs(local_10);
      local_c = local_c + 1;
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,local_c);
  return;
}

Assistant:

void count_components() {
    freopen("components.txt", "w", stdout); // output file

    int comp_num = 0;
    useddfs.resize(V, false);
    for (int i = 0; i < V; i++) {
        if (!useddfs[i]) {
            comp.clear();
            dfs(i);
            comp_num++;
        }
    }
    cout << comp_num;
}